

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsTest.cpp
# Opt level: O0

char getch_mode(int echo)

{
  int iVar1;
  undefined1 local_84 [7];
  char ch;
  termios tnew;
  termios told;
  int echo_local;
  
  initTermios(echo,(termios *)&tnew.c_ispeed,(termios *)local_84);
  iVar1 = getchar();
  resetTermios((termios *)&tnew.c_ispeed);
  return (char)iVar1;
}

Assistant:

static char getch_mode(int echo)
{
	struct termios told, tnew;
	char ch;
	initTermios(echo, &told, &tnew);
	ch = getchar();
	resetTermios(&told);
	return ch;
}